

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O1

void __thiscall
RenX_LoggingPlugin::RenX_OnSteal
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view vehicle,
          PlayerInfo *victim)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  string msg;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((*(ulong *)&this->field_0xa0 >> 0x34 & 1) == 0) {
    pcVar4 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar4 = RenX::Server::sendLogChan;
  }
  local_50 = local_40;
  pcVar1 = (this->stealFmt)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->stealFmt)._M_string_length);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,victim,(BuildingInfo *)0x0);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14e8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x14f0);
    auVar5 = RenX::translateName(vehicle._M_len,vehicle._M_str);
    RenX::replace_tag(&local_50,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    (*pcVar4)(server,local_48,local_50);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnSteal(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view vehicle, const RenX::PlayerInfo &victim)
{
	logFuncType func;
	if (RenX_LoggingPlugin::stealPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->stealFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player, &victim);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(vehicle));
		(server.*func)(msg);
	}
}